

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

void __thiscall
dgList<dgList<dgConvexHull3DFace>::dgListNode_*>::dgListNode::dgListNode
          (dgListNode *this,dgListNode **info,dgListNode *prev,dgListNode *next)

{
  this->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_0118ea08;
  this->m_info = *info;
  this->m_prev = prev;
  this->m_next = next;
  if (prev != (dgListNode *)0x0) {
    prev->m_next = this;
    next = this->m_next;
  }
  if (next != (dgListNode *)0x0) {
    next->m_prev = this;
  }
  return;
}

Assistant:

dgListNode (const T &info, dgListNode* const prev, dgListNode* const next) 
			:m_info (info) 
		{
//			HACD_ASSERT ((hacd::HaU64 (&m_info) & 0x0f) == 0);
			m_prev = prev;
			m_next = next;
			if (m_prev) {
				m_prev->m_next = this;
			}
			if (m_next) {
				m_next->m_prev = this;
			}
		}